

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.cpp
# Opt level: O2

bool isItAFunction<ThreeWiseHash<unsigned_int,unsigned_char>>(uint L)

{
  iterator *this;
  uchar uVar1;
  uint uVar2;
  uint32_conflict uVar3;
  uint uVar4;
  ostream *poVar5;
  reference puVar6;
  uint uVar7;
  int iVar8;
  uchar inchar;
  _Elt_pointer puVar9;
  _Elt_pointer puVar10;
  uint j;
  long __n;
  bool bVar11;
  uchar c;
  _Map_pointer local_1898;
  deque<unsigned_char,_std::allocator<unsigned_char>_> s;
  ThreeWiseHash<unsigned_int,_unsigned_char> hf;
  mersenneRNG generator;
  
  MTRand::seed(&generator.mtr);
  generator.n = 5;
  iVar8 = 3;
  ThreeWiseHash<unsigned_int,_unsigned_char>::ThreeWiseHash(&hf,3,L);
  std::_Deque_base<unsigned_char,_std::allocator<unsigned_char>_>::_Deque_base
            (&s.super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>);
  while (bVar11 = iVar8 != 0, iVar8 = iVar8 + -1, bVar11) {
    uVar3 = mersenneRNG::operator()(&generator);
    c = (char)uVar3 + 'A';
    std::deque<unsigned_char,_std::allocator<unsigned_char>_>::push_back(&s,&c);
    ThreeWiseHash<unsigned_int,_unsigned_char>::eat(&hf,c);
  }
  this = &s.super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Deque_impl_data._M_start;
  uVar2 = 0;
  do {
    uVar7 = uVar2;
    if (uVar7 == 100000) goto LAB_00104974;
    uVar1 = *s.super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur;
    std::deque<unsigned_char,_std::allocator<unsigned_char>_>::pop_front(&s);
    uVar3 = mersenneRNG::operator()(&generator);
    inchar = (char)uVar3 + 'A';
    c = inchar;
    std::deque<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>(&s,&c);
    ThreeWiseHash<unsigned_int,_unsigned_char>::update(&hf,uVar1,inchar);
    uVar4 = ThreeWiseHash<unsigned_int,unsigned_char>::
            hash<std::deque<unsigned_char,std::allocator<unsigned_char>>>
                      ((ThreeWiseHash<unsigned_int,unsigned_char> *)&hf,&s);
    uVar2 = uVar7 + 1;
  } while (uVar4 == hf.hashvalue);
  local_1898 = s.super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Deque_impl_data._M_start._M_node;
  puVar9 = s.super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Deque_impl_data._M_start._M_last;
  puVar10 = s.super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  while (puVar10 !=
         s.super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Deque_impl_data._M_finish._M_cur) {
    poVar5 = std::operator<<((ostream *)&std::cout,*puVar10);
    poVar5 = std::operator<<(poVar5," ");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::endl<char,std::char_traits<char>>(poVar5);
    puVar10 = puVar10 + 1;
    if (puVar10 == puVar9) {
      puVar10 = local_1898[1];
      local_1898 = local_1898 + 1;
      puVar9 = puVar10 + 0x200;
    }
  }
  poVar5 = std::operator<<((ostream *)&std::cerr,"bug");
  std::endl<char,std::char_traits<char>>(poVar5);
  puVar6 = std::_Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*>::operator[](this,0)
  ;
  poVar5 = std::operator<<((ostream *)&std::cerr,*puVar6);
  puVar6 = std::_Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*>::operator[](this,1)
  ;
  poVar5 = std::operator<<(poVar5,*puVar6);
  puVar6 = std::_Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*>::operator[](this,2)
  ;
  poVar5 = std::operator<<(poVar5,*puVar6);
  poVar5 = std::operator<<(poVar5," was hashed to ");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  poVar5 = std::operator<<(poVar5," when true hash value is ");
  ThreeWiseHash<unsigned_int,unsigned_char>::
  hash<std::deque<unsigned_char,std::allocator<unsigned_char>>>
            ((ThreeWiseHash<unsigned_int,unsigned_char> *)&hf,&s);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::endl<char,std::char_traits<char>>(poVar5);
  for (__n = 0; __n != 3; __n = __n + 1) {
    puVar6 = std::_Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*>::operator[]
                       (this,__n);
    poVar5 = std::operator<<((ostream *)&std::cerr,*puVar6);
    poVar5 = std::operator<<(poVar5,"->");
    std::_Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*>::operator[](this,__n);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::endl<char,std::char_traits<char>>(poVar5);
  }
LAB_00104974:
  std::_Deque_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Deque_base
            (&s.super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>);
  ThreeWiseHash<unsigned_int,_unsigned_char>::~ThreeWiseHash(&hf);
  return 99999 < uVar7;
}

Assistant:

bool isItAFunction(uint L = 7) {
  mersenneRNG generator(5);
  const uint n(3); // n-grams
  hashfunction hf(n, L);
  deque<unsigned char> s;
  for (uint32 k = 0; k < n; ++k) {
    unsigned char c = static_cast<unsigned char>(generator() + 65);
    s.push_back(c);
    hf.eat(c);
  }
  for (uint32 k = 0; k < 100000; ++k) {
    unsigned char out = s.front();
    s.pop_front();
    char c(generator() + 65);

    s.push_back(c);
    hf.update(out, c);
    if (hf.hash(s) != hf.hashvalue) {
      for (deque<unsigned char>::iterator ii = s.begin(); ii != s.end(); ++ii)
        cout << *ii << " " << static_cast<uint32>(*ii) << endl;
      cerr << "bug" << endl;
      cerr << s[0] << s[1] << s[2] << " was hashed to " << hf.hashvalue
           << " when true hash value is " << hf.hash(s) << endl;
      for (uint j = 0; j < n; ++j)
        cerr << s[j] << "->" << hf.hasher.hashvalues[s[j]] << endl;
      return false;
    }
  }
  return true;
}